

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWObject.h
# Opt level: O1

void __thiscall COLLADAFW::AnimationClip::AnimationClip(AnimationClip *this,UniqueId *uniqueId)

{
  ObjectId OVar1;
  undefined4 uVar2;
  
  (this->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)396>).super_Object._vptr_Object =
       (_func_int **)&PTR__ObjectTemplate_009e1470;
  uVar2 = *(undefined4 *)&uniqueId->field_0x4;
  OVar1 = uniqueId->mObjectId;
  (this->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)396>).mUniqueId.mClassId =
       uniqueId->mClassId;
  *(undefined4 *)
   &(this->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)396>).mUniqueId.field_0x4 = uVar2;
  (this->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)396>).mUniqueId.mObjectId = OVar1;
  (this->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)396>).mUniqueId.mFileId =
       uniqueId->mFileId;
  (this->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)396>).super_Object._vptr_Object =
       (_func_int **)&PTR__AnimationClip_009e1410;
  (this->mOriginalId)._M_dataplus._M_p = (pointer)&(this->mOriginalId).field_2;
  (this->mOriginalId)._M_string_length = 0;
  (this->mOriginalId).field_2._M_local_buf[0] = '\0';
  (this->mInstanceAnimationUniqueIds)._vptr_Array = (_func_int **)&PTR_releaseMemory_00929378;
  (this->mInstanceAnimationUniqueIds).mData = (UniqueId *)0x0;
  (this->mInstanceAnimationUniqueIds).mCount = 0;
  *(undefined8 *)((long)&(this->mInstanceAnimationUniqueIds).mCount + 4) = 0;
  *(undefined8 *)((long)&(this->mInstanceAnimationUniqueIds).mCapacity + 4) = 0;
  (this->mName)._M_dataplus._M_p = (pointer)&(this->mName).field_2;
  (this->mName)._M_string_length = 0;
  (this->mName).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

ObjectTemplate(const UniqueId& uniqueId) : mUniqueId(uniqueId) {}